

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O3

void __thiscall Graphics::Graphics(Graphics *this,int startScore,string *startRoom)

{
  pointer *pppAVar1;
  pointer pcVar2;
  iterator iVar3;
  GameTitle *pGVar4;
  GameTitle *local_50;
  string local_48;
  
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (startRoom->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + startRoom->_M_string_length);
  Screen::Screen(&this->screen,startScore,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pGVar4 = (GameTitle *)operator_new(0x108);
  GameTitle::GameTitle(pGVar4);
  iVar3._M_current =
       (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50 = pGVar4;
  if (iVar3._M_current ==
      (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Animation*,std::allocator<Animation*>>::_M_realloc_insert<Animation*>
              ((vector<Animation*,std::allocator<Animation*>> *)this,iVar3,(Animation **)&local_50);
  }
  else {
    *iVar3._M_current = (Animation *)pGVar4;
    pppAVar1 = &(this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  pGVar4 = (GameTitle *)operator_new(0x48);
  (pGVar4->super_Animation).description._M_string_length = 0;
  (pGVar4->super_Animation).description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pGVar4->super_Animation).name.field_2 + 8) = 0;
  (pGVar4->super_Animation).description._M_dataplus._M_p = (pointer)0x0;
  (pGVar4->super_Animation).name._M_string_length = 0;
  (pGVar4->super_Animation).name.field_2._M_allocated_capacity = 0;
  (pGVar4->super_Animation)._vptr_Animation = (_func_int **)0x0;
  (pGVar4->super_Animation).name._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)((long)&(pGVar4->super_Animation).description.field_2 + 8) = 0;
  Animation::Animation((Animation *)pGVar4);
  (pGVar4->super_Animation)._vptr_Animation = (_func_int **)&PTR_displayAnimation_00135458;
  iVar3._M_current =
       (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_50 = pGVar4;
    std::vector<Animation*,std::allocator<Animation*>>::_M_realloc_insert<Animation*>
              ((vector<Animation*,std::allocator<Animation*>> *)this,iVar3,(Animation **)&local_50);
  }
  else {
    *iVar3._M_current = (Animation *)pGVar4;
    pppAVar1 = &(this->animations).super__Vector_base<Animation_*,_std::allocator<Animation_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  return;
}

Assistant:

Graphics::Graphics(int startScore, std::string startRoom) : screen(startScore, startRoom)
{
    // Create the animations array
    animations.push_back(new GameTitle());
    animations.push_back(new Fireworks());

    // TODO: Create the menus
}